

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_uint64(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            uint64_t val,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  binary_stream_sink *this_00;
  size_t *psVar1;
  pointer psVar2;
  ldiv_t lVar3;
  int iVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  long lVar6;
  ldiv_t lVar7;
  ldiv_t lVar8;
  uint8_t buf_2 [2];
  uint8_t buf_1 [4];
  uint8_t buf [8];
  ushort local_26;
  uint local_24;
  ulong local_20;
  
  iVar4 = (int)CONCAT71(in_register_00000011,tag);
  if (iVar4 == 7) {
    if (val == 0) {
LAB_00551e7c:
      val = 0;
      goto LAB_00551e81;
    }
    lVar8 = ldiv(val,1000000000);
    lVar7.rem = -lVar8.rem;
    lVar7.quot = lVar8.quot;
    if (lVar8.rem < 1) {
      lVar8 = lVar7;
    }
  }
  else if (iVar4 == 6) {
    if (val == 0) goto LAB_00551e7c;
    lVar7 = ldiv(val,1000);
    lVar6 = lVar7.rem;
    lVar3.rem = lVar6 * 1000000;
    lVar3.quot = lVar7.quot;
    lVar8.rem = lVar6 * -1000000;
    lVar8.quot = lVar7.quot;
    if (-1 < lVar6) {
      lVar8 = lVar3;
    }
  }
  else {
    if (iVar4 != 5) {
      if (0x7f < val) {
        if (0xff < val) {
          if (val < 0x10000) {
            binary_stream_sink::push_back(&this->sink_,0xcd);
            local_26 = (ushort)val << 8 | (ushort)val >> 8;
            lVar6 = 0;
            do {
              binary_stream_sink::push_back(&this->sink_,*(uint8_t *)((long)&local_26 + lVar6));
              lVar6 = lVar6 + 1;
            } while (lVar6 != 2);
          }
          else {
            this_00 = &this->sink_;
            if (val >> 0x20 == 0) {
              binary_stream_sink::push_back(this_00,0xce);
              uVar5 = (uint)val;
              local_24 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                         uVar5 << 0x18;
              lVar6 = 0;
              do {
                binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_24 + lVar6));
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
            }
            else {
              binary_stream_sink::push_back(this_00,0xcf);
              local_20 = val >> 0x38 | (val & 0xff000000000000) >> 0x28 |
                         (val & 0xff0000000000) >> 0x18 | (val & 0xff00000000) >> 8 |
                         (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 | (val & 0xff00) << 0x28
                         | val << 0x38;
              lVar6 = 0;
              do {
                binary_stream_sink::push_back(this_00,*(uint8_t *)((long)&local_20 + lVar6));
                lVar6 = lVar6 + 1;
              } while (lVar6 != 8);
            }
          }
          goto LAB_00551e88;
        }
        binary_stream_sink::push_back(&this->sink_,0xcc);
      }
      binary_stream_sink::push_back(&this->sink_,(uint8_t)val);
      goto LAB_00551e88;
    }
LAB_00551e81:
    lVar8.rem = 0;
    lVar8.quot = val;
  }
  write_timestamp(this,lVar8.quot,lVar8.rem);
LAB_00551e88:
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t val, 
            semantic_tag tag, 
            const ser_context&,
            std::error_code&) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                    write_timestamp(static_cast<int64_t>(val), 0);
                    break;
                case semantic_tag::epoch_milli:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(static_cast<int64_t>(val), static_cast<int64_t>(millis_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem*nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(static_cast<int64_t>(val), static_cast<int64_t>(nanos_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    if (val <= static_cast<uint64_t>((std::numeric_limits<int8_t>::max)()))
                    {
                        // positive fixnum stores 7-bit positive integer
                        sink_.push_back(static_cast<uint8_t>(val));
                    }
                    else if (val <= (std::numeric_limits<uint8_t>::max)())
                    {
                        // uint 8 stores a 8-bit unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint8_type);
                        sink_.push_back(static_cast<uint8_t>(val));
                    }
                    else if (val <= (std::numeric_limits<uint16_t>::max)())
                    {
                        // uint 16 stores a 16-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint16_type);
                        binary::native_to_big(static_cast<uint16_t>(val),std::back_inserter(sink_));
                    }
                    else if (val <= (std::numeric_limits<uint32_t>::max)())
                    {
                        // uint 32 stores a 32-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint32_type);
                        binary::native_to_big(static_cast<uint32_t>(val),std::back_inserter(sink_));
                    }
                    else if (val <= (std::numeric_limits<uint64_t>::max)())
                    {
                        // uint 64 stores a 64-bit big-endian unsigned integer
                        sink_.push_back(jsoncons::msgpack::msgpack_type::uint64_type);
                        binary::native_to_big(static_cast<uint64_t>(val),std::back_inserter(sink_));
                    }
                    break;
                }
            }
            end_value();
            JSONCONS_VISITOR_RETURN;
        }